

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

errr cmdq_push_copy(command_conflict *cmd)

{
  command_conflict *src;
  
  if (cmd_head + L'\x01' == cmd_tail) {
    return 1;
  }
  if (cmd_head + L'\x01' == L'\x14' && cmd_tail == L'\0') {
    return 1;
  }
  if (cmd->code == CMD_REPEAT) {
    if (repeat_prev_allowed != '\x01') {
      return 1;
    }
    if (last_command_idx < L'\0') {
      if (last_command.code == CMD_NULL) {
        return 1;
      }
      cmd_release(cmd_queue + cmd_head);
      src = &last_command;
    }
    else {
      if (L'\x13' < last_command_idx) {
        __assert_fail("last_command_idx < CMD_QUEUE_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-core.c"
                      ,0x131,"errr cmdq_push_copy(struct command *)");
      }
      if (last_command_idx == cmd_head) goto LAB_001305b1;
      cmd_release(cmd_queue + cmd_head);
      src = cmd_queue + last_command_idx;
    }
    cmd_copy(cmd_queue + cmd_head,src);
  }
  else {
    if (last_command_idx == cmd_head) {
      cmd_release(&last_command);
      cmd_copy(&last_command,cmd_queue + cmd_head);
      last_command_idx = L'\xffffffff';
    }
    cmd_release(cmd_queue + cmd_head);
    memcpy(cmd_queue + cmd_head,cmd,0xb0);
  }
LAB_001305b1:
  cmd_head = cmd_head + L'\x01';
  if (cmd_head == L'\x14') {
    cmd_head = L'\0';
  }
  return 0;
}

Assistant:

errr cmdq_push_copy(struct command *cmd)
{
	/* If queue full, return error */
	if (cmd_head + 1 == cmd_tail) return 1;
	if (cmd_head + 1 == CMD_QUEUE_SIZE && cmd_tail == 0) return 1;

	/* Insert command into queue. */
	if (cmd->code != CMD_REPEAT) {
		if (last_command_idx == cmd_head) {
			/*
			 * The last non-background command will be overwritten.
			 * Copy out of the queue in case it is needed for
			 * CMD_REPEAT.
			 */
			cmd_release(&last_command);
			cmd_copy(&last_command, &cmd_queue[cmd_head]);
			last_command_idx = -1;
		}
		cmd_release(&cmd_queue[cmd_head]);
		cmd_queue[cmd_head] = *cmd;
	} else if (!repeat_prev_allowed) {
		return 1;
	} else {
		/*
		 * If we're repeating a command, we duplicate the previous
		 * command in the next command "slot".
		 */
		if (last_command_idx >= 0) {
			assert(last_command_idx < CMD_QUEUE_SIZE);
			if (last_command_idx != cmd_head) {
				cmd_release(&cmd_queue[cmd_head]);
				cmd_copy(&cmd_queue[cmd_head],
					&cmd_queue[last_command_idx]);
			}
		} else if (last_command.code != CMD_NULL) {
			cmd_release(&cmd_queue[cmd_head]);
			cmd_copy(&cmd_queue[cmd_head], &last_command);
		} else {
			return 1;
		}
	}

	/* Advance point in queue, wrapping around at the end */
	cmd_head++;
	if (cmd_head == CMD_QUEUE_SIZE) cmd_head = 0;

	return 0;	
}